

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::Function::RegisterBlock(Function *this,uint32_t block_id,bool is_definition)

{
  pointer *pppBVar1;
  iterator __position;
  void *pvVar2;
  __hashtable *__h;
  BasicBlock *pBVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar4;
  __node_gen_type __node_gen;
  uint32_t local_17c;
  BasicBlock local_178;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_d8;
  BasicBlock local_d0;
  
  local_17c = block_id;
  if (this->declaration_type_ != kFunctionDeclDefinition) {
    __assert_fail("declaration_type_ == FunctionDecl::kFunctionDeclDefinition && \"RegisterBlocks can only be called after declaration_type_ is defined\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                  ,0x79,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
  }
  BasicBlock::BasicBlock(&local_178,block_id);
  local_d8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)CONCAT44(local_d8._4_4_,block_id);
  local_d0.id_ = local_178.id_;
  local_d0._4_4_ = local_178._4_4_;
  local_d0.immediate_dominator_ = local_178.immediate_dominator_;
  local_d0.immediate_structural_dominator_ = local_178.immediate_structural_dominator_;
  local_d0.immediate_structural_post_dominator_ = local_178.immediate_structural_post_dominator_;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       local_178.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ =
       local_178.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ =
       local_178.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_178.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_d0.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_178.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_178.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.type_.super__Base_bitset<1UL>._M_w = local_178.type_.super__Base_bitset<1UL>._M_w;
  local_d0.reachable_ = local_178.reachable_;
  local_d0.structurally_reachable_ = local_178.structurally_reachable_;
  local_d0._90_6_ = local_178._90_6_;
  local_d0.label_ = local_178.label_;
  local_d0.terminator_ = local_178.terminator_;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_178.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_178.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.structural_predecessors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.structural_predecessors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ =
       local_178.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start._4_4_ =
       local_178.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ =
       local_178.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ =
       local_178.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_d0.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.structural_successors_.
       super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.structural_successors_.
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar4 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::BasicBlock>,std::allocator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->blocks_,&local_d8);
  pvVar2 = (void *)CONCAT44(local_d0.structural_successors_.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_d0.structural_successors_.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d0.structural_successors_.
                                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  if (local_d0.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.structural_predecessors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.successors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_d0.predecessors_.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_d0.predecessors_.
                            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_d0.predecessors_.
                                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  if (local_178.structural_successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.structural_successors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.structural_successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.structural_successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.structural_predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.structural_predecessors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.structural_predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.successors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.successors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.successors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.predecessors_.
      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.predecessors_.
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.predecessors_.
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (is_definition) {
    if (this->current_block_ != (BasicBlock *)0x0) {
      __assert_fail("current_block_ == nullptr && \"Register Block can only be called when parsing a binary outside of \" \"a BasicBlock\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                    ,0x82,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->undefined_blocks_)._M_h,&local_17c);
    pBVar3 = (BasicBlock *)
             ((long)pVar4.first.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
             + 0x10);
    this->current_block_ = pBVar3;
    __position._M_current =
         (this->ordered_blocks_).
         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ordered_blocks_).
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
      _M_realloc_insert<spvtools::val::BasicBlock*const&>
                ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
                 &this->ordered_blocks_,__position,&this->current_block_);
    }
    else {
      *__position._M_current = pBVar3;
      pppBVar1 = &(this->ordered_blocks_).
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  else if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_d8 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->undefined_blocks_;
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_d8,&local_17c);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterBlock(uint32_t block_id, bool is_definition) {
  assert(
      declaration_type_ == FunctionDecl::kFunctionDeclDefinition &&
      "RegisterBlocks can only be called after declaration_type_ is defined");

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success = false;
  tie(inserted_block, success) =
      blocks_.insert({block_id, BasicBlock(block_id)});
  if (is_definition) {  // new block definition
    assert(current_block_ == nullptr &&
           "Register Block can only be called when parsing a binary outside of "
           "a BasicBlock");

    undefined_blocks_.erase(block_id);
    current_block_ = &inserted_block->second;
    ordered_blocks_.push_back(current_block_);
  } else if (success) {  // Block doesn't exist but this is not a definition
    undefined_blocks_.insert(block_id);
  }

  return SPV_SUCCESS;
}